

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O1

void __thiscall brynet::net::DataSocket::canRecv(DataSocket *this)

{
  sock __fd;
  size_t sVar1;
  char *pcVar2;
  ssize_t sVar3;
  size_t sVar4;
  unsigned_long value;
  int *piVar5;
  uint uVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  
  bVar7 = false;
  do {
    if ((this->mSocket)._M_t.
        super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t
        .super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
        super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl == (TcpSocket *)0x0)
    break;
    sVar1 = ox_buffer_getwritevalidcount(this->mRecvBuffer);
    cVar8 = '\x03';
    if (sVar1 != 0) {
      __fd = TcpSocket::getFD((this->mSocket)._M_t.
                              super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                              .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl);
      pcVar2 = ox_buffer_getwriteptr(this->mRecvBuffer);
      iVar9 = (int)sVar1;
      sVar3 = ::recv(__fd,pcVar2,(long)iVar9,0);
      uVar6 = (uint)sVar3;
      if (uVar6 == 0) {
        bVar7 = true;
      }
      else if ((int)uVar6 < 0) {
        piVar5 = __errno_location();
        bVar7 = *piVar5 != 0xb;
      }
      else {
        ox_buffer_addwritepos(this->mRecvBuffer,(ulong)(uVar6 & 0x7fffffff));
        sVar1 = ox_buffer_getreadvalidcount(this->mRecvBuffer);
        sVar4 = ox_buffer_getsize(this->mRecvBuffer);
        if (sVar1 == sVar4) {
          growRecvBuffer(this);
        }
        if ((this->mDataCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          this->mRecvData = true;
          pcVar2 = ox_buffer_getreadptr(this->mRecvBuffer);
          sVar1 = ox_buffer_getreadvalidcount(this->mRecvBuffer);
          value = std::
                  function<unsigned_long_(brynet::net::DataSocket_*,_const_char_*,_unsigned_long)>::
                  operator()(&this->mDataCallback,this,pcVar2,sVar1);
          sVar1 = ox_buffer_getreadvalidcount(this->mRecvBuffer);
          if (sVar1 < value) {
            __assert_fail("proclen <= ox_buffer_getreadvalidcount(mRecvBuffer)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                          ,0x112,"void brynet::net::DataSocket::recv()");
          }
          sVar1 = ox_buffer_getreadvalidcount(this->mRecvBuffer);
          cVar8 = '\x03';
          if (sVar1 < value) goto LAB_00120b6a;
          ox_buffer_addreadpos(this->mRecvBuffer,value);
        }
        sVar1 = ox_buffer_getwritevalidcount(this->mRecvBuffer);
        if ((sVar1 == 0) || (sVar1 = ox_buffer_getreadvalidcount(this->mRecvBuffer), sVar1 == 0)) {
          ox_buffer_adjustto_head(this->mRecvBuffer);
        }
        cVar8 = ((int)uVar6 < iVar9) * '\x03';
        if ((int)uVar6 < iVar9) {
          bVar7 = false;
        }
      }
    }
LAB_00120b6a:
  } while (cVar8 == '\0');
  if ((bVar7) &&
     ((this->mSocket)._M_t.
      super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
      super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
      super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl != (TcpSocket *)0x0)) {
    onClose(this);
    return;
  }
  return;
}

Assistant:

void DataSocket::canRecv()
{
#ifdef PLATFORM_WINDOWS
    mPostRecvCheck = false;
    if (mSocket == nullptr && !mPostWriteCheck)
    {
        onClose();
        return;
    }
#endif

#ifdef USE_OPENSSL
    if (!mIsHandsharked && mSSL != nullptr)
    {
        processSSLHandshake();
        return;
    }
#endif

    recv();
}